

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_cont.c
# Opt level: O2

_light_pcapng_mem * light_no_copy_from_memory(uint32_t *memory,size_t size,int is_owner)

{
  uint *puVar1;
  _light_pcapng_mem *p_Var2;
  uint32_t *puVar3;
  uint32_t **ppuVar4;
  size_t sVar5;
  size_t tmp_size;
  size_t __nmemb;
  
  p_Var2 = (_light_pcapng_mem *)calloc(1,0x28);
  p_Var2->mem = memory;
  p_Var2->mem_size = size;
  p_Var2->owner = is_owner;
  __nmemb = 0;
  puVar3 = memory;
  for (; size != 0; size = size - *puVar1) {
    __nmemb = __nmemb + 1;
    p_Var2->block_count = __nmemb;
    puVar1 = puVar3 + 1;
    puVar3 = (uint32_t *)((long)puVar3 + (ulong)(*puVar1 & 0xfffffffc));
  }
  ppuVar4 = (uint32_t **)calloc(__nmemb,8);
  p_Var2->mem_blocks = ppuVar4;
  for (sVar5 = 0; __nmemb != sVar5; sVar5 = sVar5 + 1) {
    ppuVar4[sVar5] = memory;
    memory = (uint32_t *)((long)memory + (ulong)(memory[1] & 0xfffffffc));
  }
  return p_Var2;
}

Assistant:

struct _light_pcapng_mem *light_no_copy_from_memory(uint32_t *memory, size_t size, int is_owner)
{
	struct _light_pcapng_mem *head = NULL;
	head = calloc(1, sizeof(struct _light_pcapng_mem));
	__parse_mem_inplace(head, memory, size, is_owner);
	return head;
}